

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O3

void target_add_call_arg_op(c2m_ctx_t c2m_ctx,type *arg_type,target_arg_info_t *arg_info,op_t arg)

{
  undefined8 *puVar1;
  ulong uVar2;
  anon_union_32_12_57d33f68_for_u *paVar3;
  MIR_context_t ctx;
  gen_ctx_conflict *pgVar4;
  op_t mem;
  int n_qwords;
  MIR_type_t MVar5;
  uint uVar6;
  mir_size_t disp;
  MIR_op_t *pMVar7;
  void *__ptr;
  MIR_insn_t_conflict insn;
  type_mode tVar8;
  decl_t pdVar9;
  decl_t pdVar10;
  type *ret_type;
  size_t sVar11;
  VARR_MIR_op_t *pVVar12;
  ulong uVar13;
  c2m_ctx_t c2m_ctx_00;
  c2m_ctx_t pcVar14;
  MIR_insn_code_t code;
  gen_ctx_conflict *pgVar15;
  MIR_type_t qword_types [2];
  MIR_type_t aMStack_170 [2];
  MIR_op_t MStack_168;
  target_arg_info_t *ptStack_130;
  c2m_ctx_t pcStack_128;
  op_t *poStack_120;
  gen_ctx_conflict *pgStack_118;
  c2m_ctx_t pcStack_110;
  VARR_MIR_op_t *pVStack_108;
  code *pcStack_100;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  c2mir_options *in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  char in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff21;
  undefined1 in_stack_ffffffffffffff28;
  MIR_scale_t in_stack_ffffffffffffff29;
  MIR_scale_t MVar16;
  undefined6 in_stack_ffffffffffffff2a;
  undefined8 in_stack_ffffffffffffff30;
  MIR_reg_t in_stack_ffffffffffffff38;
  MIR_reg_t MVar17;
  MIR_reg_t in_stack_ffffffffffffff3c;
  MIR_reg_t MVar18;
  undefined8 in_stack_ffffffffffffff40;
  long lVar19;
  MIR_type_t local_b0 [2];
  undefined1 local_a8 [16];
  void *pvStack_98;
  char *pcStack_90;
  anon_union_32_12_57d33f68_for_u aStack_88;
  MIR_context_t local_68;
  c2mir_options *pcStack_60;
  void *pvStack_58;
  char *pcStack_50;
  int64_t iStack_48;
  char *pcStack_40;
  
  c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->ctx;
  pgVar15 = c2m_ctx->gen_ctx;
  pcStack_100 = (code *)0x1a9640;
  n_qwords = process_aggregate_arg(c2m_ctx,arg_type,arg_info,local_b0);
  tVar8 = arg_type->mode & ~TM_BASIC;
  disp = (mir_size_t)tVar8;
  if (tVar8 == TM_STRUCT) {
    if (arg.mir_op._8_1_ != '\n') {
      pcStack_100 = (code *)0x1a9846;
      __assert_fail("arg.mir_op.mode == MIR_OP_MEM",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                    ,0x192,
                    "void target_add_call_arg_op(c2m_ctx_t, struct type *, target_arg_info_t *, op_t)"
                   );
    }
    in_stack_ffffffffffffff0c = (undefined4)((ulong)arg.decl >> 0x20);
    in_stack_ffffffffffffff28 = (undefined1)arg.mir_op.u.reg;
    in_stack_ffffffffffffff29 = (MIR_scale_t)((uint)arg.mir_op.u._0_4_ >> 8);
    in_stack_ffffffffffffff2a =
         (undefined6)(CONCAT44(arg.mir_op.u.mem.alias,arg.mir_op.u.reg) >> 0x10);
    in_stack_ffffffffffffff38 = (MIR_reg_t)arg.mir_op.u._16_8_;
    in_stack_ffffffffffffff3c = (MIR_reg_t)((ulong)arg.mir_op.u._16_8_ >> 0x20);
    pcStack_100 = (code *)0x1a9683;
    mem._8_8_ = arg._8_8_;
    mem.decl = arg.decl;
    mem.mir_op.data = arg.mir_op.data;
    mem.mir_op._8_1_ = 10;
    mem.mir_op._9_7_ = arg.mir_op._9_7_;
    mem.mir_op.u.reg._0_1_ = in_stack_ffffffffffffff28;
    mem.mir_op.u.mem.scale = in_stack_ffffffffffffff29;
    mem.mir_op.u.i._2_6_ = in_stack_ffffffffffffff2a;
    mem.mir_op.u.str.s = arg.mir_op.u.str.s;
    mem.mir_op.u.mem.base = in_stack_ffffffffffffff38;
    mem.mir_op.u.mem.index = in_stack_ffffffffffffff3c;
    mem.mir_op.u.mem.disp = arg.mir_op.u.mem.disp;
    in_stack_ffffffffffffff10 = (c2mir_options *)arg._8_8_;
    in_stack_ffffffffffffff18 = arg.mir_op.data;
    in_stack_ffffffffffffff20 = arg.mir_op._8_1_;
    in_stack_ffffffffffffff21 = arg.mir_op._9_7_;
    in_stack_ffffffffffffff30 = arg.mir_op.u.str.s;
    in_stack_ffffffffffffff40 = arg.mir_op.u.mem.disp;
    mem_to_address((op_t *)local_a8,c2m_ctx,mem,1);
    arg.decl = (decl_t)local_a8._0_8_;
    arg._8_8_ = local_a8._8_8_;
    arg.mir_op.data = pvStack_98;
    arg.mir_op._8_1_ = SUB81(pcStack_90,0);
    arg.mir_op._9_7_ = SUB87((ulong)pcStack_90 >> 8,0);
    arg.mir_op.u.reg = (MIR_reg_t)aStack_88.i;
    arg.mir_op.u.mem.alias = (MIR_alias_t)((ulong)aStack_88._0_8_ >> 0x20);
    arg.mir_op.u.str.s = aStack_88.str.s;
    arg.mir_op.u._16_8_ = aStack_88._16_8_;
    arg.mir_op.u.mem.disp = aStack_88.mem.disp;
    pcStack_100 = (code *)0x1a969f;
    MVar5 = get_blk_type(n_qwords,local_b0);
    pVVar12 = pgVar15->call_ops;
    arg_info = (target_arg_info_t *)(ulong)MVar5;
    pcStack_100 = (code *)0x1a96b3;
    disp = raw_type_size(c2m_ctx,arg_type);
    uVar13 = (ulong)arg_type->align;
    if (uVar13 != 0) {
      uVar2 = (disp - 1) + uVar13;
      disp = uVar2 - uVar2 % uVar13;
    }
    arg_type = (type *)&stack0xffffffffffffff98;
    in_stack_ffffffffffffff08 = 1;
    pcStack_100 = (code *)0x1a96f4;
    pcVar14 = (c2m_ctx_t)arg_type;
    MIR_new_mem_op((MIR_op_t *)arg_type,(MIR_context_t)c2m_ctx_00,MVar5,disp,arg.mir_op.u.reg,0,
                   '\x01');
    aStack_88.i = iStack_48;
    aStack_88.str.s = pcStack_40;
    local_a8._0_8_ = local_68;
    local_a8._8_8_ = pcStack_60;
    pvStack_98 = pvStack_58;
    pcStack_90 = pcStack_50;
    pMVar7 = pVVar12->varr;
    if (pMVar7 == (MIR_op_t *)0x0) {
LAB_001a984b:
      pcStack_100 = VARR_MIR_op_taddr;
      target_add_call_arg_op_cold_2();
      if (pcVar14 != (c2m_ctx_t)0x0) {
        return;
      }
      pVStack_108 = (VARR_MIR_op_t *)target_gen_post_call_res_code;
      VARR_MIR_op_taddr_cold_1();
      ctx = c2m_ctx_00->ctx;
      pgVar4 = c2m_ctx_00->gen_ctx;
      if ((ret_type->mode != TM_BASIC) ||
         (MVar16 = in_stack_ffffffffffffff29, MVar17 = in_stack_ffffffffffffff38,
         MVar18 = in_stack_ffffffffffffff3c, lVar19 = in_stack_ffffffffffffff40,
         (ret_type->u).basic_type != TP_VOID)) {
        ptStack_130 = arg_info;
        pcStack_128 = c2m_ctx;
        poStack_120 = &arg;
        pgStack_118 = pgVar15;
        pcStack_110 = (c2m_ctx_t)arg_type;
        pVStack_108 = pVVar12;
        uVar6 = process_ret_type(c2m_ctx_00,ret_type,aMStack_170);
        MVar16 = in_stack_ffffffffffffff29;
        MVar17 = in_stack_ffffffffffffff38;
        MVar18 = in_stack_ffffffffffffff3c;
        lVar19 = in_stack_ffffffffffffff40;
        if (uVar6 != 0) {
          if (in_stack_ffffffffffffff20 != '\n') {
LAB_001a9a2c:
            __assert_fail("res.mir_op.mode == MIR_OP_MEM",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                          ,0x100,
                          "op_t target_gen_post_call_res_code(c2m_ctx_t, struct type *, op_t, MIR_insn_t, size_t)"
                         );
          }
          if (0 < (int)uVar6) {
            uVar13 = 0;
            do {
              MVar5 = aMStack_170[uVar13];
              if (MVar5 == MIR_T_F) {
                code = MIR_FMOV;
              }
              else if (MVar5 == MIR_T_D) {
                code = MIR_DMOV;
              }
              else {
                code = (uint)(MVar5 == MIR_T_LD) * 3;
              }
              MIR_new_mem_op(&MStack_168,ctx,MVar5,in_stack_ffffffffffffff40,
                             in_stack_ffffffffffffff38,in_stack_ffffffffffffff3c,
                             in_stack_ffffffffffffff29);
              pVVar12 = pgVar4->call_ops;
              if (((pVVar12 == (VARR_MIR_op_t *)0x0) || (pVVar12->varr == (MIR_op_t *)0x0)) ||
                 (pVVar12->els_num <= disp + 2 + uVar13)) {
                target_gen_post_call_res_code_cold_1();
                goto LAB_001a9a2c;
              }
              insn = MIR_new_insn(ctx,code);
              MIR_append_insn(ctx,pgVar4->curr_func,insn);
              uVar13 = uVar13 + 1;
              in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 8;
            } while (uVar6 != uVar13);
          }
        }
      }
      pcVar14->ctx = (MIR_context_t)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08);
      pcVar14->options = in_stack_ffffffffffffff10;
      ((anon_union_32_12_57d33f68_for_u *)pcVar14->env)->i = (int64_t)in_stack_ffffffffffffff18;
      (((anon_union_32_12_57d33f68_for_u *)pcVar14->env)->str).s =
           (char *)CONCAT71(in_stack_ffffffffffffff21,in_stack_ffffffffffffff20);
      *(ulong *)((long)pcVar14->env + 0x10) =
           CONCAT62(in_stack_ffffffffffffff2a,CONCAT11(MVar16,in_stack_ffffffffffffff28));
      (((anon_union_32_12_57d33f68_for_u *)pcVar14->env)->mem).disp = in_stack_ffffffffffffff30;
      ((anon_union_32_12_57d33f68_for_u *)pcVar14->env)[1].i = CONCAT44(MVar18,MVar17);
      *(long *)((long)pcVar14->env + 0x28) = lVar19;
      return;
    }
    sVar11 = pVVar12->els_num;
    uVar13 = sVar11 + 1;
    if (pVVar12->size < uVar13) {
      sVar11 = (uVar13 >> 1) + uVar13;
      pcStack_100 = (code *)0x1a9745;
      pMVar7 = (MIR_op_t *)realloc(pMVar7,sVar11 * 0x30);
      pVVar12->varr = pMVar7;
      pVVar12->size = sVar11;
      sVar11 = pVVar12->els_num;
      uVar13 = sVar11 + 1;
    }
    pVVar12->els_num = uVar13;
    paVar3 = &pMVar7[sVar11].u;
    paVar3->i = (int64_t)pvStack_98;
    (&paVar3->i)[1] = (int64_t)pcStack_90;
    (&paVar3->i)[2] = aStack_88.i;
    (&paVar3->i)[3] = (int64_t)aStack_88.str.s;
    pMVar7 = pMVar7 + sVar11;
    pMVar7->data = (void *)local_a8._0_8_;
    *(undefined8 *)&pMVar7->field_0x8 = local_a8._8_8_;
    (pMVar7->u).i = (int64_t)pvStack_98;
    (pMVar7->u).str.s = pcStack_90;
  }
  else {
    pcStack_100 = (code *)0x1a9788;
    c2m_ctx_00 = (c2m_ctx_t)arg_type;
    pcVar14 = c2m_ctx;
    MVar5 = get_mir_type(c2m_ctx,arg_type);
    pgVar15 = (gen_ctx_conflict *)pgVar15->call_ops;
    pVVar12 = (VARR_MIR_op_t *)(ulong)MVar5;
    __ptr = (pgVar15->zero_op).mir_op.data;
    if (__ptr == (void *)0x0) {
      pcStack_100 = (code *)0x1a984b;
      target_add_call_arg_op_cold_1();
      goto LAB_001a984b;
    }
    pdVar10 = (pgVar15->zero_op).decl;
    pdVar9 = (decl_t)&pdVar10->field_0x1;
    if (*(undefined1 **)&(pgVar15->zero_op).field_0x8 < pdVar9) {
      pcStack_100 = (code *)0x1a97cb;
      __ptr = realloc(__ptr,(long)((long)pdVar9 + ((ulong)pdVar9 >> 1)) * 0x30);
      (pgVar15->zero_op).mir_op.data = __ptr;
      *(undefined1 **)&(pgVar15->zero_op).field_0x8 =
           (undefined1 *)((long)pdVar9 + ((ulong)pdVar9 >> 1));
      pdVar10 = (pgVar15->zero_op).decl;
      pdVar9 = (decl_t)&pdVar10->field_0x1;
    }
    (pgVar15->zero_op).decl = pdVar9;
    *(ulong *)((long)__ptr + (long)pdVar10 * 0x30 + 0x10) =
         CONCAT44(arg.mir_op.u.mem.alias,arg.mir_op.u.reg);
    *(char **)((long)__ptr + (long)pdVar10 * 0x30 + 0x18) = arg.mir_op.u.str.s;
    *(undefined8 *)((long)__ptr + (long)pdVar10 * 0x30 + 0x20) = arg.mir_op.u._16_8_;
    *(MIR_disp_t *)((long)__ptr + (long)pdVar10 * 0x30 + 0x28) = arg.mir_op.u.mem.disp;
    puVar1 = (undefined8 *)((long)__ptr + (long)pdVar10 * 0x30);
    *puVar1 = arg.mir_op.data;
    puVar1[1] = CONCAT71(arg.mir_op._9_7_,arg.mir_op._8_1_);
    puVar1[2] = CONCAT44(arg.mir_op.u.mem.alias,arg.mir_op.u.reg);
    puVar1[3] = arg.mir_op.u.str.s;
    if ((MVar5 & 0x1e) == MIR_T_F) {
      arg_info->n_fregs = arg_info->n_fregs + 1;
    }
    else if (MVar5 != MIR_T_LD) {
      arg_info->n_iregs = arg_info->n_iregs + 1;
    }
  }
  return;
}

Assistant:

static void target_add_call_arg_op (c2m_ctx_t c2m_ctx, struct type *arg_type,
                                    target_arg_info_t *arg_info, op_t arg) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t type;
  MIR_type_t qword_types[MAX_QWORDS];
  int n_qwords = process_aggregate_arg (c2m_ctx, arg_type, arg_info, qword_types);

  /* pass aggregates on the stack and pass by value for others: */
  if (arg_type->mode != TM_STRUCT && arg_type->mode != TM_UNION) {
    type = get_mir_type (c2m_ctx, arg_type);
    VARR_PUSH (MIR_op_t, call_ops, arg.mir_op);
    if (type == MIR_T_F || type == MIR_T_D)
      arg_info->n_fregs++;
    else if (type != MIR_T_LD)
      arg_info->n_iregs++;
  } else {
    assert (arg.mir_op.mode == MIR_OP_MEM);
    arg = mem_to_address (c2m_ctx, arg, TRUE);
    type = get_blk_type (n_qwords, qword_types);
    VARR_PUSH (MIR_op_t, call_ops,
               MIR_new_mem_op (ctx, type, type_size (c2m_ctx, arg_type), arg.mir_op.u.reg, 0, 1));
  }
}